

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testInvalidClipWrongMinMax(void)

{
  RepeatedField<long> *pRVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  ModelDescription *pMVar5;
  Type *pTVar6;
  FeatureType *pFVar7;
  ArrayFeatureType *pAVar8;
  TypeUnion this;
  Type *this_00;
  LayerUnion this_01;
  ostream *poVar9;
  string *psVar10;
  long lVar11;
  Rep *pRVar12;
  int iVar13;
  int iVar14;
  Result res1;
  Model m;
  undefined1 local_78 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  Model local_50;
  
  CoreML::Specification::Model::Model(&local_50);
  if (local_50.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_50.description_ = pMVar5;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_50.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar2 = local_78 + 0x10;
  local_78._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar6->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((pointer)local_78._0_8_ != pcVar2) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7 == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  if (pFVar7->_oneof_case_[0] == 5) {
    pAVar8 = (pFVar7->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    pAVar8 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar8);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  pRVar1 = &pAVar8->shape_;
  iVar14 = (pAVar8->shape_).current_size_;
  iVar13 = (pAVar8->shape_).total_size_;
  if (iVar14 == iVar13) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar14 + 1);
    iVar14 = (pAVar8->shape_).current_size_;
    iVar13 = (pAVar8->shape_).total_size_;
  }
  pRVar12 = (pAVar8->shape_).rep_;
  iVar4 = iVar14 + 1;
  (pAVar8->shape_).current_size_ = iVar4;
  pRVar12->elements[iVar14] = 3;
  if (iVar4 == iVar13) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar14 + 2);
    iVar4 = (pAVar8->shape_).current_size_;
    iVar13 = (pAVar8->shape_).total_size_;
    pRVar12 = (pAVar8->shape_).rep_;
  }
  iVar14 = iVar4 + 1;
  pRVar1->current_size_ = iVar14;
  pRVar12->elements[iVar4] = 5;
  if (iVar14 == iVar13) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar4 + 2);
    iVar14 = (pAVar8->shape_).current_size_;
    pRVar12 = (pAVar8->shape_).rep_;
  }
  pRVar1->current_size_ = iVar14 + 1;
  pRVar12->elements[iVar14] = 2;
  if (local_50.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_50.description_ = pMVar5;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_50.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_78._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"output","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar6->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((pointer)local_78._0_8_ != pcVar2) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7 == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  if (pFVar7->_oneof_case_[0] == 5) {
    pAVar8 = (pFVar7->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    pAVar8 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar8);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  pRVar1 = &pAVar8->shape_;
  iVar14 = (pAVar8->shape_).current_size_;
  iVar13 = (pAVar8->shape_).total_size_;
  if (iVar14 == iVar13) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar14 + 1);
    iVar14 = (pAVar8->shape_).current_size_;
    iVar13 = (pAVar8->shape_).total_size_;
  }
  pRVar12 = (pAVar8->shape_).rep_;
  iVar4 = iVar14 + 1;
  (pAVar8->shape_).current_size_ = iVar4;
  pRVar12->elements[iVar14] = 3;
  if (iVar4 == iVar13) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar14 + 2);
    iVar4 = (pAVar8->shape_).current_size_;
    iVar13 = (pAVar8->shape_).total_size_;
    pRVar12 = (pAVar8->shape_).rep_;
  }
  iVar14 = iVar4 + 1;
  pRVar1->current_size_ = iVar14;
  pRVar12->elements[iVar4] = 5;
  if (iVar14 == iVar13) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar4 + 2);
    iVar14 = (pAVar8->shape_).current_size_;
    pRVar12 = (pAVar8->shape_).rep_;
  }
  pRVar1->current_size_ = iVar14 + 1;
  pRVar12->elements[iVar14] = 2;
  if (local_50._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_50);
    local_50._oneof_case_[0] = 500;
    this.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this.neuralnetwork_);
    local_50.Type_.pipelineclassifier_ = this.pipelineclassifier_;
  }
  (local_50.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_50.Type_.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"output");
  if (this_00->_oneof_case_[0] == 0x294) {
    this_01 = this_00->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
    this_00->_oneof_case_[0] = 0x294;
    this_01.convolution_ = (ConvolutionLayerParams *)operator_new(0x20);
    CoreML::Specification::ClipLayerParams::ClipLayerParams(this_01.clip_);
    (this_00->layer_).clip_ = (ClipLayerParams *)this_01;
  }
  ((this_01.activation_)->NonlinearityType_).linear_ = (ActivationLinear *)0x3ecccccd3f99999a;
  CoreML::validate<(MLModelType)500>((Result *)local_78,&local_50);
  bVar3 = CoreML::Result::good((Result *)local_78);
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x15ba);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"!((res1).good())",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  }
  else {
    psVar10 = CoreML::Result::message_abi_cxx11_((Result *)local_78);
    iVar14 = 0;
    lVar11 = std::__cxx11::string::find((char *)psVar10,0x326b24,0);
    if (lVar11 != -1) goto LAB_00190c12;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x15bb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"res1.message().find(\"smaller\") != std::string::npos",0x33);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  }
  std::ostream::put((char)poVar9);
  iVar14 = 1;
  std::ostream::flush();
LAB_00190c12:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._8_8_ != &local_60) {
    operator_delete((void *)local_78._8_8_,local_60._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_50);
  return iVar14;
}

Assistant:

int testInvalidClipWrongMinMax() {

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(2);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input");
    layers->add_output("output");

    // value of minval should be smaller than value of maxval

    auto* params1 = layers->mutable_clip();
    params1->set_minval(1.2f);
    params1->set_maxval(0.4f);

    Result res1 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res1);
    ML_ASSERT(res1.message().find("smaller") != std::string::npos);

    return 0;

}